

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

char * __thiscall rapidxml::memory_pool<char>::allocate_raw(memory_pool<char> *this,size_t size)

{
  char *local_20;
  void *memory;
  size_t size_local;
  memory_pool<char> *this_local;
  
  if (this->m_alloc_func == (alloc_func *)0x0) {
    local_20 = (char *)operator_new__(size);
  }
  else {
    local_20 = (char *)(*this->m_alloc_func)(size);
    if (local_20 == (char *)0x0) {
      __assert_fail("memory",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/deps/rapidxml-1.13/rapidxml/rapidxml.hpp"
                    ,0x24a,"char *rapidxml::memory_pool<>::allocate_raw(std::size_t) [Ch = char]");
    }
  }
  return local_20;
}

Assistant:

char *allocate_raw(std::size_t size)
        {
            // Allocate
            void *memory;   
            if (m_alloc_func)   // Allocate memory using either user-specified allocation function or global operator new[]
            {
                memory = m_alloc_func(size);
                assert(memory); // Allocator is not allowed to return 0, on failure it must either throw, stop the program or use longjmp
            }
            else
            {
                memory = new char[size];
#ifdef RAPIDXML_NO_EXCEPTIONS
                if (!memory)            // If exceptions are disabled, verify memory allocation, because new will not be able to throw bad_alloc
                    RAPIDXML_PARSE_ERROR("out of memory", 0);
#endif
            }
            return static_cast<char *>(memory);
        }